

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::compiler::Compiler::Node> * __thiscall
kj::Own<capnp::compiler::Compiler::Node>::operator=
          (Own<capnp::compiler::Compiler::Node> *this,Own<capnp::compiler::Compiler::Node> *other)

{
  Node *object;
  Node *this_00;
  Node *pNVar1;
  Disposer *in_RDX;
  
  object = (Node *)this->disposer;
  this_00 = this->ptr;
  pNVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pNVar1;
  other->ptr = (Node *)0x0;
  if (this_00 != (Node *)0x0) {
    Disposer::Dispose_<capnp::compiler::Compiler::Node,_true>::dispose
              ((Dispose_<capnp::compiler::Compiler::Node,_true> *)this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }